

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_deserialize_container
          (t_lua_generator *this,ostream *out,t_type *ttype,bool local,string *prefix)

{
  int *piVar1;
  t_type *ptVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string *prefix_00;
  string size;
  string etype;
  string vtype;
  string ktype;
  t_field fsize;
  t_field fetype;
  t_field fvtype;
  t_field fktype;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  t_field local_2f0;
  t_field local_240;
  t_field local_190;
  t_field local_e0;
  
  std::__cxx11::string::string((string *)&local_370,"_size",(allocator *)&local_2f0);
  t_generator::tmp(&local_4d0,(t_generator *)this,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_390,"_ktype",(allocator *)&local_2f0);
  t_generator::tmp(&local_470,(t_generator *)this,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,"_vtype",(allocator *)&local_2f0);
  t_generator::tmp(&local_490,(t_generator *)this,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3d0,"_etype",(allocator *)&local_2f0);
  t_generator::tmp(&local_4b0,(t_generator *)this,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  ptVar2 = g_type_i32;
  std::__cxx11::string::string((string *)&local_3f0,(string *)&local_4d0);
  t_field::t_field(&local_2f0,ptVar2,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  ptVar2 = g_type_i8;
  std::__cxx11::string::string((string *)&local_410,(string *)&local_470);
  t_field::t_field(&local_e0,ptVar2,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  ptVar2 = g_type_i8;
  std::__cxx11::string::string((string *)&local_430,(string *)&local_490);
  t_field::t_field(&local_190,ptVar2,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  ptVar2 = g_type_i8;
  std::__cxx11::string::string((string *)&local_450,(string *)&local_4b0);
  t_field::t_field(&local_240,ptVar2,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  poVar4 = t_generator::indent((t_generator *)this,out);
  pcVar5 = "";
  if (local) {
    pcVar5 = "local ";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,(string *)prefix);
  poVar4 = std::operator<<(poVar4," = {}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"local ");
      poVar4 = std::operator<<(poVar4,(string *)&local_4b0);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&local_4d0);
      pcVar5 = " = iprot:readSetBegin()";
      goto LAB_00240258;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"local ");
      poVar4 = std::operator<<(poVar4,(string *)&local_4b0);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&local_4d0);
      pcVar5 = " = iprot:readListBegin()";
      goto LAB_00240258;
    }
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"local ");
    poVar4 = std::operator<<(poVar4,(string *)&local_470);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,(string *)&local_490);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,(string *)&local_4d0);
    pcVar5 = " = iprot:readMapBegin() ";
LAB_00240258:
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"for _i=1,");
  poVar4 = std::operator<<(poVar4,(string *)&local_4d0);
  poVar4 = std::operator<<(poVar4," do");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      prefix_00 = &local_330;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,prefix_00);
      goto LAB_00240355;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      prefix_00 = &local_350;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_list_element(this,out,(t_list *)ttype,prefix_00);
      goto LAB_00240355;
    }
  }
  else {
    prefix_00 = &local_310;
    std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,prefix_00);
LAB_00240355:
    std::__cxx11::string::~string((string *)prefix_00);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar3 == '\0') goto LAB_00240408;
      poVar4 = t_generator::indent((t_generator *)this,out);
      pcVar5 = "iprot:readListEnd()";
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      pcVar5 = "iprot:readSetEnd()";
    }
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    pcVar5 = "iprot:readMapEnd()";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
LAB_00240408:
  t_field::~t_field(&local_240);
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  t_field::~t_field(&local_2f0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_4d0);
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_container(ostream& out,
                                                     t_type* ttype,
                                                     bool local,
                                                     string prefix) {
  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_field fsize(g_type_i32, size);
  t_field fktype(g_type_i8, ktype);
  t_field fvtype(g_type_i8, vtype);
  t_field fetype(g_type_i8, etype);

  // Declare variables, read header
  indent(out) << (local ? "local " : "") << prefix << " = {}" << endl;
  if (ttype->is_map()) {
    indent(out) << "local " << ktype << ", " << vtype << ", " << size << " = iprot:readMapBegin() "
                << endl;
  } else if (ttype->is_set()) {
    indent(out) << "local " << etype << ", " << size << " = iprot:readSetBegin()" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "local " << etype << ", " << size << " = iprot:readListBegin()" << endl;
  }

  // Deserialize
  indent(out) << "for _i=1," << size << " do" << endl;
  indent_up();

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  indent_down();
  indent(out) << "end" << endl;

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "iprot:readMapEnd()" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "iprot:readSetEnd()" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "iprot:readListEnd()" << endl;
  }
}